

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O3

SharedDispatcher __thiscall
AmsConnection::CreateNotifyMapping
          (AmsConnection *this,uint32_t hNotify,shared_ptr<Notification> *notification)

{
  NotificationDispatcher *this_00;
  long *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined4 in_register_00000034;
  SharedDispatcher SVar2;
  shared_ptr<Notification> local_28;
  
  DispatcherListAdd(this,(VirtualConnection *)CONCAT44(in_register_00000034,hNotify));
  local_28.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RCX;
  *(uint32_t *)
   (((local_28.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->buffer).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 8) = (uint32_t)notification;
  this_00 = (NotificationDispatcher *)this->router;
  local_28.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RCX[1];
  if (local_28.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  NotificationDispatcher::Emplace(this_00,(uint32_t)notification,&local_28);
  _Var1._M_pi = extraout_RDX;
  if (local_28.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  SVar2.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  SVar2.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedDispatcher)
         SVar2.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedDispatcher AmsConnection::CreateNotifyMapping(uint32_t hNotify, std::shared_ptr<Notification> notification)
{
    auto dispatcher = DispatcherListAdd(notification->connection);
    notification->hNotify(hNotify);
    dispatcher->Emplace(hNotify, notification);
    return dispatcher;
}